

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search_suite.cpp
# Opt level: O0

void search_null(void)

{
  undefined1 local_2e9;
  basic_variable<std::allocator<char>_> local_2e8;
  iterator local_2b0;
  iterator local_298;
  undefined1 local_27b [2];
  undefined1 local_279;
  basic_variable<std::allocator<char>_> local_278;
  iterator local_248;
  iterator local_230;
  undefined1 local_213 [2];
  undefined1 local_211;
  iterator local_210;
  iterator local_1f8;
  undefined1 local_1db [2];
  undefined1 local_1d9;
  iterator local_1d8;
  iterator local_1c0;
  undefined1 local_1a3 [2];
  undefined1 local_1a1;
  iterator local_1a0;
  iterator local_188;
  undefined1 local_16b [2];
  undefined1 local_169;
  iterator local_168;
  iterator local_150;
  undefined1 local_133 [2];
  undefined1 local_131;
  double local_130;
  iterator local_128;
  iterator local_110;
  undefined1 local_f7 [2];
  undefined1 local_f5;
  int local_f4;
  iterator local_f0;
  iterator local_d8;
  undefined1 local_bc [2];
  undefined1 local_ba;
  bool local_b9;
  iterator local_b8;
  iterator local_a0;
  undefined1 local_87 [2];
  undefined1 local_85;
  nullable local_84;
  iterator local_80;
  iterator local_58;
  undefined1 local_3a [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_58,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_80,(basic_variable<std::allocator<char>_> *)local_38);
  local_84 = null;
  local_3a[0] = std::
                binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::nullable>
                          (&local_58,&local_80,&local_84);
  local_85 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), null)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x18,"void search_null()",local_3a,&local_85);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_80);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_58);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_a0,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_b8,(basic_variable<std::allocator<char>_> *)local_38);
  local_b9 = true;
  local_87[0] = std::
                binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,bool>
                          (&local_a0,&local_b8,&local_b9);
  local_ba = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), true)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x19,"void search_null()",local_87,&local_ba);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_d8,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_f0,(basic_variable<std::allocator<char>_> *)local_38);
  local_f4 = 2;
  local_bc[0] = std::
                binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,int>
                          (&local_d8,&local_f0,&local_f4);
  local_f5 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), 2)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x1a,"void search_null()",local_bc,&local_f5);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_110,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_128,(basic_variable<std::allocator<char>_> *)local_38);
  local_130 = 3.0;
  local_f7[0] = std::
                binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,double>
                          (&local_110,&local_128,&local_130);
  local_131 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), 3.0)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x1b,"void search_null()",local_f7,&local_131);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_128);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_110);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_150,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_168,(basic_variable<std::allocator<char>_> *)local_38);
  local_133[0] = std::
                 binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char[6]>
                           (&local_150,&local_168,(char (*) [6])"alpha");
  local_169 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), \"alpha\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x1c,"void search_null()",local_133,&local_169);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_168);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_150);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_188,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1a0,(basic_variable<std::allocator<char>_> *)local_38);
  local_16b[0] = std::
                 binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,wchar_t[6]>
                           (&local_188,&local_1a0,(wchar_t (*) [6])L"bravo");
  local_1a1 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), L\"bravo\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x1d,"void search_null()",local_16b,&local_1a1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_188);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1c0,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1d8,(basic_variable<std::allocator<char>_> *)local_38);
  local_1a3[0] = std::
                 binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char16_t[8]>
                           (&local_1c0,&local_1d8,(char16_t (*) [8])L"charlie");
  local_1d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), u\"charlie\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x1e,"void search_null()",local_1a3,&local_1d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1f8,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_210,(basic_variable<std::allocator<char>_> *)local_38);
  local_1db[0] = std::
                 binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char32_t[6]>
                           (&local_1f8,&local_210,(char32_t (*) [6])L"delta");
  local_211 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), U\"delta\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x1f,"void search_null()",local_1db,&local_211);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_210);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_230,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_248,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_213[0] = std::
                 binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
                           (&local_230,&local_248,&local_278);
  local_279 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), array::make())","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x20,"void search_null()",local_213,&local_279);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_278);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_248);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_230);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_298,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_2b0,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_27b[0] = std::
                 binary_search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
                           (&local_298,&local_2b0,&local_2e8);
  local_2e9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::binary_search(data.begin(), data.end(), map::make())","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/binary_search_suite.cpp"
             ,0x21,"void search_null()",local_27b,&local_2e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_298);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void search_null()
{
    variable data;
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), null), false);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), true), false);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), 2), false);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), 3.0), false);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), "alpha"), false);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), L"bravo"), false);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), u"charlie"), false);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), U"delta"), false);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), array::make()), false);
    TRIAL_PROTOCOL_TEST_EQUAL(std::binary_search(data.begin(), data.end(), map::make()), false);
}